

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snr.cc
# Opt level: O2

int main(int argc,char **argv)

{
  double dVar1;
  char *pcVar2;
  long lVar3;
  bool bVar4;
  bool bVar5;
  char cVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  ostream *poVar10;
  istream *input_stream;
  int iVar11;
  ulong uVar12;
  char *pcVar13;
  double dVar14;
  double dVar15;
  allocator local_62d;
  int frame_length;
  string local_628;
  double local_608;
  double dStack_600;
  double local_5f0;
  vector<double,_std::allocator<double>_> signal;
  vector<double,_std::allocator<double>_> signal_plus_noise;
  int tmp;
  ifstream ifs2;
  byte abStack_420 [488];
  ifstream ifs1;
  byte abStack_218 [488];
  
  frame_length = 0x100;
  local_608 = 0.0;
LAB_00102595:
  iVar7 = ya_getopt_long(argc,argv,"l:o:h",(option *)0x0,(int *)0x0);
  if (iVar7 == 0x6c) goto code_r0x001025ac;
  if (iVar7 == -1) {
    lVar8 = (long)argc;
    if (argc - ya_optind == 1) {
      lVar3 = lVar8 + -1;
      pcVar13 = (char *)0x0;
    }
    else {
      if (argc - ya_optind != 2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs1);
        std::operator<<((ostream *)&ifs1,"Just two input files, file1 and infile, are required");
        std::__cxx11::string::string((string *)&ifs2,"snr",(allocator *)&tmp);
        sptk::PrintErrorMessage((string *)&ifs2,(ostringstream *)&ifs1);
        goto LAB_00102828;
      }
      lVar3 = lVar8 + -2;
      pcVar13 = argv[lVar8 + -1];
    }
    pcVar2 = argv[lVar3];
    std::ifstream::ifstream(&ifs1);
    std::ifstream::open((char *)&ifs1,(_Ios_Openmode)pcVar2);
    dVar14 = local_608;
    if ((abStack_218[*(long *)(_ifs1 + -0x18)] & 5) != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs2);
      poVar10 = std::operator<<((ostream *)&ifs2,"Cannot open file ");
      std::operator<<(poVar10,pcVar2);
      std::__cxx11::string::string((string *)&tmp,"snr",(allocator *)&local_628);
      sptk::PrintErrorMessage((string *)&tmp,(ostringstream *)&ifs2);
      std::__cxx11::string::~string((string *)&tmp);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ifs2);
      iVar7 = 1;
      goto LAB_00102e3b;
    }
    input_stream = (istream *)&ifs2;
    std::ifstream::ifstream(input_stream);
    if ((pcVar13 != (char *)0x0) &&
       (std::ifstream::open((char *)&ifs2,(_Ios_Openmode)pcVar13),
       (abStack_420[*(long *)(_ifs2 + -0x18)] & 5) != 0)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&tmp);
      poVar10 = std::operator<<((ostream *)&tmp,"Cannot open file ");
      std::operator<<(poVar10,pcVar13);
      std::__cxx11::string::string((string *)&local_628,"snr",(allocator *)&signal);
      sptk::PrintErrorMessage(&local_628,(ostringstream *)&tmp);
      goto LAB_00102e14;
    }
    cVar6 = std::__basic_file<char>::is_open();
    if (cVar6 == '\0') {
      input_stream = (istream *)&std::cin;
    }
    if (SUB84(dVar14,0) == 0) {
      local_608 = 0.0;
      dStack_600 = 0.0;
      while ((bVar5 = sptk::ReadStream<double>((double *)&signal,(istream *)&ifs1), bVar5 &&
             (bVar5 = sptk::ReadStream<double>((double *)&signal_plus_noise,input_stream), bVar5)))
      {
        local_608 = local_608 +
                    (double)signal.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start *
                    (double)signal.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start;
        dStack_600 = dStack_600 +
                     ((double)signal_plus_noise.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start -
                     (double)signal.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start) *
                     ((double)signal_plus_noise.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start -
                     (double)signal.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start);
      }
      if ((local_608 != 0.0) || (NAN(local_608))) {
        if ((dStack_600 == 0.0) && (!NAN(dStack_600))) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&tmp);
          std::operator<<((ostream *)&tmp,"The noise power is 0.0");
          std::__cxx11::string::string((string *)&local_628,"snr",&local_62d);
          sptk::PrintErrorMessage(&local_628,(ostringstream *)&tmp);
          goto LAB_00102e14;
        }
        dVar14 = log10(local_608 / dStack_600);
        bVar5 = sptk::WriteStream<double>(dVar14 * 10.0,(ostream *)&std::cout);
        if (!bVar5) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&tmp);
          std::operator<<((ostream *)&tmp,"Failed to write SNR");
          std::__cxx11::string::string((string *)&local_628,"snr",&local_62d);
          sptk::PrintErrorMessage(&local_628,(ostringstream *)&tmp);
          goto LAB_00102e14;
        }
        goto LAB_00102da3;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&tmp);
      std::operator<<((ostream *)&tmp,"The signal power is 0.0");
      std::__cxx11::string::string((string *)&local_628,"snr",&local_62d);
      sptk::PrintErrorMessage(&local_628,(ostringstream *)&tmp);
LAB_00102e14:
      std::__cxx11::string::~string((string *)&local_628);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&tmp);
      iVar7 = 1;
      goto LAB_00102e2e;
    }
    if (2 < SUB84(dVar14,0)) goto LAB_00102da3;
    std::vector<double,_std::allocator<double>_>::vector
              (&signal,(long)frame_length,(allocator_type *)&tmp);
    std::vector<double,_std::allocator<double>_>::vector
              (&signal_plus_noise,(long)frame_length,(allocator_type *)&tmp);
    local_5f0 = 0.0;
    iVar11 = 0;
    goto LAB_0010295f;
  }
  if (iVar7 == 0x68) {
    anon_unknown.dwarf_2ef3::PrintUsage((ostream *)&std::cout);
    return 0;
  }
  if (iVar7 != 0x6f) {
    anon_unknown.dwarf_2ef3::PrintUsage((ostream *)&std::cerr);
    return 1;
  }
  std::__cxx11::string::string((string *)&ifs1,ya_optarg,(allocator *)&ifs2);
  bVar5 = sptk::ConvertStringToInteger((string *)&ifs1,&tmp);
  if (bVar5) {
    bVar5 = sptk::IsInRange(tmp,0,2);
    std::__cxx11::string::~string((string *)&ifs1);
    if (bVar5) {
      local_608 = (double)(ulong)(uint)tmp;
      goto LAB_00102595;
    }
  }
  else {
    std::__cxx11::string::~string((string *)&ifs1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs1);
  poVar10 = std::operator<<((ostream *)&ifs1,"The argument for the -o option must be an integer ");
  poVar10 = std::operator<<(poVar10,"in the range of ");
  poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0);
  poVar10 = std::operator<<(poVar10," to ");
  std::ostream::operator<<((ostream *)poVar10,2);
  std::__cxx11::string::string((string *)&ifs2,"snr",(allocator *)&local_628);
  sptk::PrintErrorMessage((string *)&ifs2,(ostringstream *)&ifs1);
  goto LAB_00102828;
code_r0x001025ac:
  std::__cxx11::string::string((string *)&ifs1,ya_optarg,(allocator *)&ifs2);
  bVar4 = sptk::ConvertStringToInteger((string *)&ifs1,&frame_length);
  bVar5 = frame_length < 1;
  std::__cxx11::string::~string((string *)&ifs1);
  if (!bVar4 || bVar5) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs1);
    std::operator<<((ostream *)&ifs1,"The argument for the -l option must be a positive integer");
    std::__cxx11::string::string((string *)&ifs2,"snr",(allocator *)&tmp);
    sptk::PrintErrorMessage((string *)&ifs2,(ostringstream *)&ifs1);
LAB_00102828:
    std::__cxx11::string::~string((string *)&ifs2);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ifs1);
    return 1;
  }
  goto LAB_00102595;
LAB_0010295f:
  bVar5 = sptk::ReadStream<double>(false,0,0,frame_length,&signal,(istream *)&ifs1,(int *)0x0);
  if ((!bVar5) ||
     (bVar5 = sptk::ReadStream<double>
                        (false,0,0,frame_length,&signal_plus_noise,input_stream,(int *)0x0), !bVar5)
     ) {
    iVar7 = 0;
    bVar5 = true;
    if ((iVar11 != 0 && local_608._0_4_ == 1) &&
       (bVar4 = sptk::WriteStream<double>(local_5f0 / (double)iVar11,(ostream *)&std::cout), !bVar4)
       ) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&tmp);
      std::operator<<((ostream *)&tmp,"Failed to write segmental SNR");
      std::__cxx11::string::string((string *)&local_628,"snr",&local_62d);
      sptk::PrintErrorMessage(&local_628,(ostringstream *)&tmp);
LAB_00102d69:
      std::__cxx11::string::~string((string *)&local_628);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&tmp);
      iVar7 = 1;
      bVar5 = false;
    }
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&signal_plus_noise.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&signal.super__Vector_base<double,_std::allocator<double>_>);
    if (bVar5) {
LAB_00102da3:
      iVar7 = 0;
    }
LAB_00102e2e:
    std::ifstream::~ifstream(&ifs2);
LAB_00102e3b:
    std::ifstream::~ifstream(&ifs1);
    return iVar7;
  }
  uVar9 = (ulong)(uint)frame_length;
  if (frame_length < 1) {
    uVar9 = 0;
  }
  dVar14 = 0.0;
  dVar15 = 0.0;
  for (uVar12 = 0; uVar9 != uVar12; uVar12 = uVar12 + 1) {
    dVar1 = signal.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar12];
    dVar14 = dVar14 + dVar1 * dVar1;
    dVar15 = dVar15 + (signal_plus_noise.super__Vector_base<double,_std::allocator<double>_>._M_impl
                       .super__Vector_impl_data._M_start[uVar12] - dVar1) *
                      (signal_plus_noise.super__Vector_base<double,_std::allocator<double>_>._M_impl
                       .super__Vector_impl_data._M_start[uVar12] - dVar1);
  }
  if ((dVar14 == 0.0) && (!NAN(dVar14))) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&tmp);
    poVar10 = std::operator<<((ostream *)&tmp,"The signal power of ");
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,iVar11);
    std::operator<<(poVar10,"th frame is 0.0");
    std::__cxx11::string::string((string *)&local_628,"snr",&local_62d);
    sptk::PrintErrorMessage(&local_628,(ostringstream *)&tmp);
    goto LAB_00102d69;
  }
  if ((dVar15 == 0.0) && (!NAN(dVar15))) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&tmp);
    poVar10 = std::operator<<((ostream *)&tmp,"The noise power of ");
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,iVar11);
    std::operator<<(poVar10,"th frame is 0.0");
    std::__cxx11::string::string((string *)&local_628,"snr",&local_62d);
    sptk::PrintErrorMessage(&local_628,(ostringstream *)&tmp);
    goto LAB_00102d69;
  }
  dVar14 = log10(dVar14 / dVar15);
  if (SUB84(local_608,0) == 1) {
    local_5f0 = local_5f0 + dVar14 * 10.0;
  }
  else if ((SUB84(local_608,0) == 2) &&
          (bVar5 = sptk::WriteStream<double>(dVar14 * 10.0,(ostream *)&std::cout), !bVar5)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&tmp);
    poVar10 = std::operator<<((ostream *)&tmp,"Failed to write segmental SNR of ");
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,iVar11);
    std::operator<<(poVar10,"th frame");
    std::__cxx11::string::string((string *)&local_628,"snr",&local_62d);
    sptk::PrintErrorMessage(&local_628,(ostringstream *)&tmp);
    goto LAB_00102d69;
  }
  iVar11 = iVar11 + 1;
  goto LAB_0010295f;
}

Assistant:

int main(int argc, char* argv[]) {
  int frame_length(kDefaultFrameLength);
  OutputType output_type(kDefaultOutputType);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "l:o:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &frame_length) ||
            frame_length <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be a positive integer";
          sptk::PrintErrorMessage("snr", error_message);
          return 1;
        }
        break;
      }
      case 'o': {
        const int min(0);
        const int max(static_cast<int>(OutputType::kNumOutputTypes) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -o option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("snr", error_message);
          return 1;
        }
        output_type = static_cast<OutputType>(tmp);
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  // Get input file names.
  const char* signal_file;
  const char* signal_plus_noise_file;
  const int num_input_files(argc - optind);
  if (2 == num_input_files) {
    signal_file = argv[argc - 2];
    signal_plus_noise_file = argv[argc - 1];
  } else if (1 == num_input_files) {
    signal_file = argv[argc - 1];
    signal_plus_noise_file = NULL;
  } else {
    std::ostringstream error_message;
    error_message << "Just two input files, file1 and infile, are required";
    sptk::PrintErrorMessage("snr", error_message);
    return 1;
  }

  // Open stream for reading signal sequence.
  std::ifstream ifs1;
  ifs1.open(signal_file, std::ios::in | std::ios::binary);
  if (ifs1.fail()) {
    std::ostringstream error_message;
    error_message << "Cannot open file " << signal_file;
    sptk::PrintErrorMessage("snr", error_message);
    return 1;
  }
  std::istream& stream_for_signal(ifs1);

  // Open stream for reading signal plus noise sequence.
  std::ifstream ifs2;
  if (NULL != signal_plus_noise_file) {
    ifs2.open(signal_plus_noise_file, std::ios::in | std::ios::binary);
    if (ifs2.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << signal_plus_noise_file;
      sptk::PrintErrorMessage("snr", error_message);
      return 1;
    }
  }
  std::istream& stream_for_signal_plus_noise(ifs2.is_open() ? ifs2 : std::cin);

  if (OutputType::kSnr == output_type) {
    double signal;
    double signal_plus_noise;
    double signal_power(0.0);
    double noise_power(0.0);
    while (
        sptk::ReadStream(&signal, &stream_for_signal) &&
        sptk::ReadStream(&signal_plus_noise, &stream_for_signal_plus_noise)) {
      signal_power += signal * signal;

      const double noise(signal_plus_noise - signal);
      noise_power += noise * noise;
    }

    if (0.0 == signal_power) {
      std::ostringstream error_message;
      error_message << "The signal power is 0.0";
      sptk::PrintErrorMessage("snr", error_message);
      return 1;
    }
    if (0.0 == noise_power) {
      std::ostringstream error_message;
      error_message << "The noise power is 0.0";
      sptk::PrintErrorMessage("snr", error_message);
      return 1;
    }

    const double snr(10.0 * std::log10(signal_power / noise_power));
    if (!sptk::WriteStream(snr, &std::cout)) {
      std::ostringstream error_message;
      error_message << "Failed to write SNR";
      sptk::PrintErrorMessage("snr", error_message);
      return 1;
    }
  } else if (OutputType::kSegmentalSnr == output_type ||
             OutputType::kSegmentalSnrPerFrame == output_type) {
    std::vector<double> signal(frame_length);
    std::vector<double> signal_plus_noise(frame_length);
    double segmental_snr(0.0);
    int frame_index(0);
    for (; sptk::ReadStream(false, 0, 0, frame_length, &signal,
                            &stream_for_signal, NULL) &&
           sptk::ReadStream(false, 0, 0, frame_length, &signal_plus_noise,
                            &stream_for_signal_plus_noise, NULL);
         ++frame_index) {
      double segmental_signal_power(0.0);
      double segmental_noise_power(0.0);

      for (int i(0); i < frame_length; ++i) {
        segmental_signal_power += signal[i] * signal[i];

        const double noise(signal_plus_noise[i] - signal[i]);
        segmental_noise_power += noise * noise;
      }
      if (0.0 == segmental_signal_power) {
        std::ostringstream error_message;
        error_message << "The signal power of " << frame_index
                      << "th frame is 0.0";
        sptk::PrintErrorMessage("snr", error_message);
        return 1;
      }
      if (0.0 == segmental_noise_power) {
        std::ostringstream error_message;
        error_message << "The noise power of " << frame_index
                      << "th frame is 0.0";
        sptk::PrintErrorMessage("snr", error_message);
        return 1;
      }

      const double segmental_snr_of_current_frame(
          10.0 * std::log10(segmental_signal_power / segmental_noise_power));
      if (OutputType::kSegmentalSnr == output_type) {
        segmental_snr += segmental_snr_of_current_frame;
      } else if (OutputType::kSegmentalSnrPerFrame == output_type) {
        if (!sptk::WriteStream(segmental_snr_of_current_frame, &std::cout)) {
          std::ostringstream error_message;
          error_message << "Failed to write segmental SNR of " << frame_index
                        << "th frame";
          sptk::PrintErrorMessage("snr", error_message);
          return 1;
        }
      }
    }

    if (OutputType::kSegmentalSnr == output_type && 0 < frame_index) {
      segmental_snr /= frame_index;
      if (!sptk::WriteStream(segmental_snr, &std::cout)) {
        std::ostringstream error_message;
        error_message << "Failed to write segmental SNR";
        sptk::PrintErrorMessage("snr", error_message);
        return 1;
      }
    }
  }

  return 0;
}